

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

char encode(char input)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char cVar4;
  bool bVar5;
  
  if ((byte)(input + 0xbfU) < 0x1a) {
    cVar1 = ' ';
    if (input != 'E') {
      if ((input & 1U) == 0) {
        bVar5 = SBORROW1(input,'W');
        cVar1 = -0x57;
        cVar4 = '\x04';
        cVar2 = -0x16;
      }
      else {
        bVar5 = SBORROW1(input,'U');
        cVar1 = -0x55;
        cVar4 = '\x06';
        cVar2 = -0x14;
      }
      if (bVar5 != (char)(input + cVar1) < '\0') {
        cVar2 = cVar4;
      }
      return cVar2 + input;
    }
  }
  else {
    cVar1 = '-';
    if (input == ' ') {
      iVar3 = rand();
      cVar1 = (char)iVar3 +
              ((char)(uint)((ulong)((long)iVar3 * 0x66666667) >> 0x22) - (char)(iVar3 >> 0x1f)) *
              -10 + '0';
    }
  }
  return cVar1;
}

Assistant:

char encode(const char input) {
  if (input >= 'A' && input <= 'Z') {
    if (input == 'E') return ' ';
    if (input % 2) {
      return input + 6 <= 'Z' ? input + 6 : input - 20;
    } else {
      return input + 4 <= 'Z' ? input + 4 : input - 22;
    }
  }
  if (input == ' ') return '0' + (char)(rand() % 10);
  else return '-';
}